

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O2

void Test13(void)

{
  test_failure *this;
  string *v;
  allocator<char> local_4d1;
  string local_4d0 [27];
  string local_170;
  string local_150 [288];
  
  std::__cxx11::string::string<std::allocator<char>>(local_150,"",(allocator<char> *)local_4d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"?",&local_4d1);
  Test13::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)local_150,&local_170,v);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string(local_150);
  this = (test_failure *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4d0,
             "\" expecting \" \"test(\\\"\\\", \\\"?\\\")\" \" to throw \" \"std::exception\"",
             &local_4d1);
  cute::test_failure::test_failure
            (this,local_4d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x193);
  __cxa_throw(this,&cute::do_not_use_this_namespace::assert_throws_failure_exception::typeinfo,
              cute::do_not_use_this_namespace::assert_throws_failure_exception::
              ~assert_throws_failure_exception);
}

Assistant:

void Test13()
{
	auto test = [](std::string k, std::string v)
	{
		std::vector<std::pair<std::string, std::string>> map;
		map.push_back(std::pair(k, v));
		auto matcher = ConfusableMatcher(map, { });
	};

	ASSERT_THROWS(test("", "?"), std::exception);
	ASSERT_THROWS(test("?", ""), std::exception);
	ASSERT_THROWS(test("", ""), std::exception);
	ASSERT_THROWS(test(std::string("\x00", 1), "?"), std::exception);
	ASSERT_THROWS(test("?", std::string("\x00", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x01", 1), "?"), std::exception);
	ASSERT_THROWS(test("?", std::string("\x01", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x00", 1), std::string("\x01", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x00", 1), std::string("\x00", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x01", 1), std::string("\x00", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x01", 1), std::string("\x01", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x01\x00", 2), std::string("\x00\x01", 2)), std::exception);
	ASSERT_THROWS(test(std::string("A\x00", 2), std::string("\x00""A", 2)), std::exception);
	ASSERT_THROWS(test(std::string("\x01\x00", 2), std::string("\x00\x01", 2)), std::exception);
	test(std::string("A\x00", 2), std::string("A\x01", 2));
	test(std::string("A\x01", 2), std::string("A\x00", 2));
	test(std::string("A\x00", 2), std::string("A\x00", 2));
	test(std::string("A\x01", 2), std::string("A\x01", 2));
}